

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O0

void test_async_connect(void)

{
  ostream *poVar1;
  runtime_error *this;
  ostringstream oss;
  stream_socket *in_stack_00000138;
  stream_socket *in_stack_00000140;
  stream_socket s2;
  stream_socket s1;
  acceptor acc;
  io_service srv;
  _func_void_error_code_ptr *in_stack_fffffffffffffd18;
  callback<void_(const_std::error_code_&)> *in_stack_fffffffffffffd20;
  string local_2b8 [32];
  ostringstream local_298 [391];
  allocator local_111;
  string local_110 [32];
  endpoint local_f0 [8];
  stream_socket local_e8 [63];
  allocator local_a9;
  string local_a8 [32];
  endpoint local_88 [8];
  stream_socket local_80 [64];
  acceptor local_40 [48];
  io_service local_10 [16];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Test async connect");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  booster::aio::io_service::io_service(local_10);
  reset_glb(local_10);
  booster::aio::acceptor::acceptor(local_40,local_10);
  booster::aio::stream_socket::stream_socket(local_80,local_10);
  booster::aio::acceptor::open(local_40,1);
  booster::aio::basic_socket::set_option(local_40,2,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"127.0.0.1",&local_a9);
  booster::aio::endpoint::endpoint(local_88,local_a8,0x1f90);
  booster::aio::acceptor::bind((endpoint *)local_40);
  booster::aio::endpoint::~endpoint(local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  booster::aio::acceptor::listen((int)local_40);
  booster::callback<void(std::error_code_const&)>::callback<void(*)(std::error_code_const&)>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  booster::aio::acceptor::async_accept((stream_socket *)local_40,(callback *)local_80);
  booster::callback<void_(const_std::error_code_&)>::~callback
            ((callback<void_(const_std::error_code_&)> *)0x11cc6a);
  booster::aio::stream_socket::stream_socket(local_e8,local_10);
  booster::aio::stream_socket::open(local_e8,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"127.0.0.1",&local_111);
  booster::aio::endpoint::endpoint(local_f0,local_110,0x1f90);
  booster::callback<void(std::error_code_const&)>::callback<void(*)(std::error_code_const&)>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  booster::aio::stream_socket::async_connect((endpoint *)local_e8,(callback *)local_f0);
  booster::callback<void_(const_std::error_code_&)>::~callback
            ((callback<void_(const_std::error_code_&)> *)0x11cd20);
  booster::aio::endpoint::~endpoint(local_f0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  booster::aio::io_service::run();
  if (calls_no == 6) {
    booster::aio::basic_io_device::set_non_blocking(SUB81(local_80,0));
    booster::aio::basic_io_device::set_non_blocking(SUB81(local_e8,0));
    test_connected(in_stack_00000140,in_stack_00000138);
    booster::aio::stream_socket::~stream_socket(local_e8);
    booster::aio::stream_socket::~stream_socket(local_80);
    booster::aio::acceptor::~acceptor(local_40);
    booster::aio::io_service::~io_service(local_10);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_298);
  poVar1 = std::operator<<((ostream *)local_298,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x14f);
  std::operator<<(poVar1," calls_no == 6");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_2b8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_async_connect()
{
	std::cout << "Test async connect" << std::endl;
	io::io_service srv;
	reset_glb(srv);
	io::acceptor acc(srv);
	io::stream_socket s1(srv);
	acc.open(io::pf_inet);
    #ifndef BOOSTER_WIN32
	acc.set_option(io::stream_socket::reuse_address,true);
    #endif
	acc.bind(io::endpoint("127.0.0.1",8080));
	acc.listen(1);
	acc.async_accept(s1,async_accept_handler);
	io::stream_socket s2(srv);
	s2.open(io::pf_inet);
	s2.async_connect(io::endpoint("127.0.0.1",8080),async_connect_handler);
	srv.run();
	TEST(calls_no == 6);
	s1.set_non_blocking(false);
	s2.set_non_blocking(false);
	test_connected(s1,s2);
}